

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O3

void __thiscall
rapidjson::internal::Stack<rapidjson::CrtAllocator>::ShrinkToFit
          (Stack<rapidjson::CrtAllocator> *this)

{
  size_t newCapacity;
  
  newCapacity = (long)this->stackTop_ - (long)this->stack_;
  if (newCapacity != 0) {
    Resize(this,newCapacity);
    return;
  }
  free(this->stack_);
  this->stackEnd_ = (char *)0x0;
  this->stack_ = (char *)0x0;
  this->stackTop_ = (char *)0x0;
  return;
}

Assistant:

void ShrinkToFit() { 
        if (Empty()) {
            // If the stack is empty, completely deallocate the memory.
            Allocator::Free(stack_); // NOLINT (+clang-analyzer-unix.Malloc)
            stack_ = 0;
            stackTop_ = 0;
            stackEnd_ = 0;
        }
        else
            Resize(GetSize());
    }